

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::settxfee(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffa38;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffa40;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  allocator<char> *in_stack_fffffffffffffa78;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffffa80;
  RPCArgOptions *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffa90;
  Fallback *in_stack_fffffffffffffa98;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  RPCArg *in_stack_fffffffffffffab0;
  RPCResult *result;
  allocator<char> *this_00;
  RPCResult *this_01;
  allocator<char> local_4ac;
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9;
  pointer local_4a8;
  _Alloc_hider _Stack_4a0;
  pointer local_498;
  allocator<char> local_48a;
  allocator<char> local_489 [9];
  undefined8 in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffb9c;
  undefined8 in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  allocator<char> local_441 [225];
  RPCMethodImpl *in_stack_fffffffffffffca0;
  undefined1 local_170 [264];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::operator+(&in_stack_fffffffffffffa88->skip_type_check,&in_stack_fffffffffffffa80->m_names);
  std::operator+(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  uVar3 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffa48,(Optional *)in_stack_fffffffffffffa40);
  std::operator+(&in_stack_fffffffffffffa88->skip_type_check,&in_stack_fffffffffffffa80->m_names);
  std::operator+(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48);
  std::__cxx11::string::string(in_stack_fffffffffffffa50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa38);
  RPCArg::RPCArg(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                 (Type)((ulong)in_stack_fffffffffffffaa0 >> 0x20),in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffa98 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffa38);
  __l._M_len = (size_type)in_stack_fffffffffffffa88;
  __l._M_array = in_stack_fffffffffffffa80;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa78,__l,
             (allocator_type *)in_stack_fffffffffffffa70);
  this_01 = (RPCResult *)local_489;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  this_00 = &local_48a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_4a8 = (pointer)0x0;
  _Stack_4a0._M_p = (pointer)0x0;
  local_498 = (pointer)0x0;
  result = (RPCResult *)&local_4a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa38);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,in_stack_fffffffffffffaa8,
             in_stack_fffffffffffffaa0,(bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  HelpExampleCli(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  HelpExampleRpc(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::operator+(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffa38,(string *)0xc84e30);
  this = (RPCArg *)&stack0xfffffffffffffb30;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::settxfee()::__0,void>(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,
             (string *)CONCAT44(in_stack_fffffffffffffb9c,uVar3),
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb90,
             (RPCResults *)in_stack_fffffffffffffb88,(RPCExamples *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffca0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ac);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ab);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4aa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4a9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_489);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa48);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_170;
  puVar1 = local_68;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_441);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan settxfee()
{
    return RPCHelpMan{"settxfee",
                "\nSet the transaction fee rate in " + CURRENCY_UNIT + "/kvB for this wallet. Overrides the global -paytxfee command line parameter.\n"
                "Can be deactivated by passing 0 as the fee. In that case automatic fee selection will be used by default.\n",
                {
                    {"amount", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "The transaction fee rate in " + CURRENCY_UNIT + "/kvB"},
                },
                RPCResult{
                    RPCResult::Type::BOOL, "", "Returns true if successful"
                },
                RPCExamples{
                    HelpExampleCli("settxfee", "0.00001")
            + HelpExampleRpc("settxfee", "0.00001")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    CAmount nAmount = AmountFromValue(request.params[0]);
    CFeeRate tx_fee_rate(nAmount, 1000);
    CFeeRate max_tx_fee_rate(pwallet->m_default_max_tx_fee, 1000);
    if (tx_fee_rate == CFeeRate(0)) {
        // automatic selection
    } else if (tx_fee_rate < pwallet->chain().relayMinFee()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("txfee cannot be less than min relay tx fee (%s)", pwallet->chain().relayMinFee().ToString()));
    } else if (tx_fee_rate < pwallet->m_min_fee) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("txfee cannot be less than wallet min fee (%s)", pwallet->m_min_fee.ToString()));
    } else if (tx_fee_rate > max_tx_fee_rate) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("txfee cannot be more than wallet max tx fee (%s)", max_tx_fee_rate.ToString()));
    }

    pwallet->m_pay_tx_fee = tx_fee_rate;
    return true;
},
    };
}